

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O2

RealType RosenB(int n,RealType alpha)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  if ((alpha != 0.0) || (NAN(alpha))) {
    dVar1 = exp(alpha);
    dVar2 = exp(-alpha);
    dVar3 = exp(alpha);
    dVar4 = exp(-alpha);
    dVar7 = 1.0;
    dVar5 = dVar1 - dVar2;
    for (uVar6 = 1; uVar6 <= (uint)n; uVar6 = uVar6 + 1) {
      dVar8 = -dVar3 - dVar4;
      if ((uVar6 & 1) == 0) {
        dVar8 = dVar1 - dVar2;
      }
      dVar7 = dVar7 * (alpha / (double)uVar6);
      dVar5 = dVar5 + dVar8 * dVar7;
    }
    dVar5 = dVar5 / (dVar7 * alpha);
  }
  else {
    puts("WARNING, a = 0 in RosenB");
    dVar5 = pow(-1.0,(double)n);
    dVar5 = (1.0 - dVar5) / ((double)n + 1.0);
  }
  return dVar5;
}

Assistant:

inline RealType RosenB(int n, RealType alpha) {
  RealType RosenB_;

  if (alpha != 0.) {
    RealType Term   = 1.;
    bool IsPositive = true;

    // These two expressions are (up to constant factors) equivalent
    // to computing the hyperbolic sine and cosine of a respectively
    // The series consists of adding up these terms in an alternating fashion
    RealType PSinhRosenA = exp(alpha) - exp(-alpha);
    RealType PCoshRosenA = -exp(alpha) - exp(-alpha);
    RealType TheSum      = PSinhRosenA;
    RealType PHyperRosenA;
    for (unsigned nu = 1; nu <= (unsigned)n; nu++) {
      if (IsPositive) {
        PHyperRosenA = PCoshRosenA;
        IsPositive   = false;
      } else  // term to add should be negative
      {
        PHyperRosenA = PSinhRosenA;
        IsPositive   = true;
      }
      Term *= alpha / nu;
      TheSum += Term * PHyperRosenA;
    }
    RosenB_ = TheSum / (alpha * Term);
  } else  // pathological case of a=0
  {
    printf("WARNING, a = 0 in RosenB\n");
    RosenB_ = (1. - pow(-1., n)) / (n + 1.);
  }
  return RosenB_;
}